

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

uint32_t WriteBinaryNode(aiNode *node)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint i;
  ulong uVar5;
  uint i_1;
  long lVar6;
  
  ofs = WriteMagic(0x123c);
  uVar1 = Write<aiString>(&node->mName);
  uVar2 = Write<aiMatrix4x4t<float>>(&node->mTransformation);
  uVar3 = Write<unsigned_int>(&node->mNumChildren);
  uVar4 = Write<unsigned_int>(&node->mNumMeshes);
  uVar1 = uVar4 + uVar3 + uVar2 + uVar1;
  lVar6 = 0;
  for (uVar5 = 0; uVar5 < node->mNumMeshes; uVar5 = uVar5 + 1) {
    uVar2 = Write<unsigned_int>((uint *)((long)node->mMeshes + lVar6));
    uVar1 = uVar1 + uVar2;
    lVar6 = lVar6 + 4;
  }
  for (uVar5 = 0; uVar5 < node->mNumChildren; uVar5 = uVar5 + 1) {
    uVar2 = WriteBinaryNode(node->mChildren[uVar5]);
    uVar1 = uVar1 + uVar2 + 8;
  }
  ChangeInteger(ofs,uVar1);
  return uVar1;
}

Assistant:

uint32_t WriteBinaryNode(const aiNode* node)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AINODE);
	len += Write<aiString>(node->mName);
	len += Write<aiMatrix4x4>(node->mTransformation);
	len += Write<unsigned int>(node->mNumChildren);
	len += Write<unsigned int>(node->mNumMeshes);

	for (unsigned int i = 0; i < node->mNumMeshes;++i) {
		len += Write<unsigned int>(node->mMeshes[i]);
	}

	for (unsigned int i = 0; i < node->mNumChildren;++i) {
		len += WriteBinaryNode(node->mChildren[i])+8;
	}

	ChangeInteger(old,len);
	return len;
}